

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

void Mop_ManReduce(Mop_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  abctime aVar7;
  Vec_Wec_t *vGroups;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vGroup2;
  abctime aVar9;
  abctime time;
  int iVar10;
  uint uVar11;
  char *pStr;
  uint uVar12;
  
  aVar7 = Abc_Clock();
  vGroups = Mop_ManCreateGroups(p);
  uVar2 = Mop_ManCountOutputLits(p);
  iVar1 = vGroups->nSize;
  iVar10 = 0;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  uVar11 = 0;
  for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
    pVVar8 = Vec_WecEntry(vGroups,iVar10);
    iVar4 = Mop_ManRemoveIdentical(p,pVVar8);
    uVar11 = uVar11 + iVar4;
  }
  iVar10 = 0;
  uVar12 = 0;
  while (iVar10 != iVar3) {
    pVVar8 = Vec_WecEntry(vGroups,iVar10);
    iVar10 = iVar10 + 1;
    for (iVar4 = iVar10; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      vGroup2 = Vec_WecEntry(vGroups,iVar4);
      iVar5 = Mop_ManMergeContainTwo(p,pVVar8,vGroup2);
      uVar12 = uVar12 + iVar5;
    }
  }
  uVar6 = Mop_ManCountOutputLits(p);
  Mop_ManUnCreateGroups(p,vGroups);
  Vec_WecFree(vGroups);
  pStr = (char *)(ulong)(uint)p->vCubes->nSize;
  printf("Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ",pStr,
         (ulong)uVar11,(ulong)uVar12,(ulong)uVar2,(ulong)uVar6);
  aVar9 = Abc_Clock();
  Abc_PrintTime((int)aVar9 - (int)aVar7,pStr,time);
  return;
}

Assistant:

void Mop_ManReduce( Mop_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, nOutLits, nOutLits2, nEqual = 0, nContain = 0;
    Vec_Wec_t * vGroups = Mop_ManCreateGroups( p );
    // initial stats
    nOutLits = Mop_ManCountOutputLits( p );
    // check identical cubes within each group
    Vec_WecForEachLevel( vGroups, vGroup, i )
        nEqual += Mop_ManRemoveIdentical( p, vGroup );
    // check contained cubes
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            nContain += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    // final stats
    nOutLits2 = Mop_ManCountOutputLits( p );
    Mop_ManUnCreateGroups( p, vGroups );
    Vec_WecFree( vGroups );
    // report
    printf( "Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ", Vec_IntSize(p->vCubes), nEqual, nContain, nOutLits, nOutLits2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}